

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::adjustDefaultAppearances
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *obj,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *dr_map)

{
  string *data;
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *rnames;
  QPDFObjectHandle da_stream;
  QPDFObjectHandle DA;
  string new_da;
  ResourceReplacer rr;
  Pl_Buffer buf_pl;
  ResourceFinder rf;
  allocator<char> local_1a1;
  QPDFObjectHandle local_1a0;
  QPDFObjectHandle local_190;
  undefined1 local_180 [16];
  string local_170;
  ResourceReplacer local_150;
  Pl_Buffer local_108;
  string local_d0;
  ResourceFinder local_b0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"/DA",(allocator<char> *)&local_150);
  QPDFObjectHandle::getKey(&local_190,(string *)obj);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = QPDFObjectHandle::isString(&local_190);
  if (bVar1) {
    ResourceFinder::ResourceFinder(&local_b0);
    data = (string *)(this->super_QPDFDocumentHelper).qpdf;
    QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)&local_150,&local_190);
    QPDFObjectHandle::newStream((QPDF *)&local_1a0,data);
    std::__cxx11::string::~string((string *)&local_150);
    QPDF::numWarnings((this->super_QPDFDocumentHelper).qpdf);
    QPDFObjectHandle::parseAsContents(&local_1a0,&local_b0.super_ParserCallbacks);
    QPDF::numWarnings((this->super_QPDFDocumentHelper).qpdf);
    rnames = ResourceFinder::getNamesByResourceType_abi_cxx11_(&local_b0);
    anon_unknown.dwarf_1ad05c::ResourceReplacer::ResourceReplacer(&local_150,dr_map,rnames);
    Pl_Buffer::Pl_Buffer(&local_108,"filtered DA",(Pipeline *)0x0);
    QPDFObjectHandle::filterAsContents
              (&local_1a0,&local_150.super_TokenFilter,&local_108.super_Pipeline);
    Pl_Buffer::getString_abi_cxx11_((string *)(local_180 + 0x10),&local_108);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"/DA",&local_1a1);
    QPDFObjectHandle::newString((string *)local_180);
    QPDFObjectHandle::replaceKey(obj,&local_d0,(QPDFObjectHandle *)local_180);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180 + 8));
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)(local_180 + 0x10));
    Pl_Buffer::~Pl_Buffer(&local_108);
    anon_unknown.dwarf_1ad05c::ResourceReplacer::~ResourceReplacer(&local_150);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ResourceFinder::~ResourceFinder(&local_b0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_190.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustDefaultAppearances(
    QPDFObjectHandle obj, std::map<std::string, std::map<std::string, std::string>> const& dr_map)
{
    // This method is called on a field that has been copied from another file but whose /DA still
    // refers to resources in the original file's /DR.

    // When appearance streams are generated for variable text fields (see ISO 32000 PDF spec
    // section 12.7.3.3), the field's /DA is used to generate content of the appearance stream. /DA
    // contains references to resources that may be resolved in the document's /DR dictionary, which
    // appears in the document's /AcroForm dictionary. For fields that we copied from other
    // documents, we need to ensure that resources are mapped correctly in the case of conflicting
    // names. For example, if a.pdf's /DR has /F1 pointing to one font and b.pdf's /DR also has /F1
    // but it points elsewhere, we need to make sure appearance streams of fields copied from b.pdf
    // into a.pdf use whatever font /F1 meant in b.pdf, not whatever it means in a.pdf. This method
    // takes care of that. It is only called on fields copied from foreign files.

    // A few notes:
    //
    // * If the from document's /DR and the current document's /DR have conflicting keys, we have
    //   already resolved the conflicts before calling this method. The dr_map parameter contains
    //   the mapping from old keys to new keys.
    //
    // * /DA may be inherited from the document's /AcroForm dictionary. By the time this method has
    //   been called, we have already copied any document-level values into the fields to avoid
    //   having them inherit from the new document. This was done in adjustInheritedFields.

    auto DA = obj.getKey("/DA");
    if (!DA.isString()) {
        return;
    }

    // Find names in /DA. /DA is a string that contains content stream-like code, so we create a
    // stream out of the string and then filter it. We don't attach the stream to anything, so it
    // will get discarded.
    ResourceFinder rf;
    auto da_stream = QPDFObjectHandle::newStream(&qpdf, DA.getUTF8Value());
    try {
        auto nwarnings = qpdf.numWarnings();
        da_stream.parseAsContents(&rf);
        if (qpdf.numWarnings() > nwarnings) {
            QTC::TC("qpdf", "QPDFAcroFormDocumentHelper /DA parse error");
        }
    } catch (std::exception& e) {
        // No way to reproduce in test suite right now since error conditions are converted to
        // warnings.
        obj.warnIfPossible(
            std::string("Unable to parse /DA: ") + e.what() +
            "; this form field may not update properly");
        return;
    }

    // Regenerate /DA by filtering its tokens.
    ResourceReplacer rr(dr_map, rf.getNamesByResourceType());
    Pl_Buffer buf_pl("filtered DA");
    da_stream.filterAsContents(&rr, &buf_pl);
    std::string new_da = buf_pl.getString();
    obj.replaceKey("/DA", QPDFObjectHandle::newString(new_da));
}